

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_c_wrap(qpdf_data qpdf,function<void_()> *fn)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_8_1_3fcf6586 local_40;
  function<void_(_qpdf_data_*)> local_38;
  function<void_()> *local_18;
  function<void_()> *fn_local;
  qpdf_data qpdf_local;
  
  local_40.fn = fn;
  local_18 = fn;
  fn_local = (function<void_()> *)qpdf;
  std::function<void(_qpdf_data*)>::
  function<qpdf_c_wrap(_qpdf_data*,std::function<void()>)::__0,void>
            ((function<void(_qpdf_data*)> *)&local_38,&local_40);
  QVar1 = trap_errors(qpdf,&local_38);
  std::function<void_(_qpdf_data_*)>::~function(&local_38);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_c_wrap(qpdf_data qpdf, std::function<void()> fn)
{
    return trap_errors(qpdf, [&fn](qpdf_data) { fn(); });
}